

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
::emplace<slang::SVInt>
          (sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>
           *this,SVInt *key)

{
  bool bVar1;
  size_t sVar2;
  EntryPointer current_entry;
  char distance_from_desired;
  pair<ska::detailv3::sherwood_v3_table<slang::SVInt,_slang::SVInt,_std::hash<slang::SVInt>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<slang::SVInt>_>,_std::equal_to<slang::SVInt>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::SVInt>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::SVInt>,_8UL>_>::templated_iterator<slang::SVInt>,_bool>
  pVar3;
  
  sVar2 = slang::SVInt::hash(key);
  current_entry =
       this->entries + (sVar2 * -0x61c8864680b583eb >> ((this->hash_policy).shift & 0x3fU));
  distance_from_desired = '\0';
  while( true ) {
    if (current_entry->distance_from_desired < distance_from_desired) {
      pVar3 = emplace_new_key<slang::SVInt>(this,distance_from_desired,current_entry,key);
      return pVar3;
    }
    bVar1 = slang::exactlyEqual(key,&(current_entry->field_1).value);
    if (bVar1) break;
    current_entry = current_entry + 1;
    distance_from_desired = distance_from_desired + '\x01';
  }
  pVar3._8_8_ = 0;
  pVar3.first.current = current_entry;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }